

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

void __thiscall
google::protobuf::UnknownFieldSet::AddVarint(UnknownFieldSet *this,int number,uint64 value)

{
  iterator __position;
  vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *this_00;
  UnknownField local_28;
  
  this_00 = (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *
            )this->fields_;
  if (this_00 ==
      (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *)0x0)
  {
    this_00 = (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>
               *)operator_new(0x18);
    *(undefined8 *)&this_00->field_0x0 = 0;
    *(undefined8 *)(this_00 + 8) = 0;
    *(undefined8 *)(this_00 + 0x10) = 0;
    this->fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         this_00;
  }
  local_28._0_4_ = number & 0x1fffffff;
  __position._M_current = *(UnknownField **)(this_00 + 8);
  if (__position._M_current == *(UnknownField **)(this_00 + 0x10)) {
    local_28.field_2.varint_ = value;
    std::vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>::
    _M_realloc_insert<google::protobuf::UnknownField_const&>(this_00,__position,&local_28);
  }
  else {
    *(ulong *)__position._M_current = CONCAT44(local_28._4_4_,number) & 0xffffffff1fffffff;
    ((__position._M_current)->field_2).varint_ = value;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
  }
  return;
}

Assistant:

void UnknownFieldSet::AddVarint(int number, uint64 value) {
  if (fields_ == NULL) fields_ = new vector<UnknownField>;
  UnknownField field;
  field.number_ = number;
  field.type_ = UnknownField::TYPE_VARINT;
  field.varint_ = value;
  fields_->push_back(field);
}